

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageOutput.cpp
# Opt level: O2

ImageOutput * __thiscall
ImageOutput::drawBoundary
          (ImageOutput *this,Mat *image,
          vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *boundary)

{
  undefined8 *puVar1;
  long *plVar2;
  ImageOutput *pIVar3;
  undefined8 *in_RCX;
  undefined8 *puVar4;
  Mat local_128 [96];
  Mat local_c8 [96];
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  Mat *local_48;
  ImageOutput *local_40;
  Mat *local_38;
  
  puVar1 = (undefined8 *)in_RCX[1];
  local_48 = image;
  local_40 = this;
  local_38 = (Mat *)boundary;
  for (puVar4 = (undefined8 *)*in_RCX; pIVar3 = local_40, puVar4 != puVar1; puVar4 = puVar4 + 2) {
    local_58 = *puVar4;
    uStack_50 = puVar4[1];
    plVar2 = *(long **)(local_48 + 0x18);
    cv::Mat::Mat(local_c8,local_38);
    local_68 = (undefined4)local_58;
    uStack_64 = local_58._4_4_;
    uStack_60 = (undefined4)uStack_50;
    uStack_5c = uStack_50._4_4_;
    (**(code **)(*plVar2 + 8))(local_128,plVar2,local_c8,&local_68);
    cv::Mat::~Mat(local_128);
    cv::Mat::~Mat(local_c8);
  }
  cv::Mat::Mat((Mat *)local_40,local_38);
  return pIVar3;
}

Assistant:

cv::Mat ImageOutput::drawBoundary(cv::Mat image,
                                  std::vector<cv::Rect> boundary) {
  for (auto bound : boundary) {  // in case of multiple boundaries
    getWriter()->drawRectangle(image, bound);  // call helper class
  }
  return image;
}